

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O1

KeyFormatData *
cfd::core::GetKeyFormatFromVersion(KeyFormatData *__return_storage_ptr__,uint32_t version)

{
  bool bVar1;
  CfdException *this;
  KeyFormatData *format_data;
  KeyFormatData *this_00;
  undefined1 local_50 [32];
  
  GetKeyFormatList();
  this_00 = (KeyFormatData *)local_50._0_8_;
  do {
    if (this_00 == (KeyFormatData *)local_50._8_8_) {
      ::std::vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>::~vector
                ((vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_> *)
                 local_50);
LAB_0047058d:
      this = (CfdException *)__cxa_allocate_exception(0x30);
      local_50._0_8_ = local_50 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"unsupported extkey version.","");
      CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_50);
      __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
    }
    bVar1 = KeyFormatData::IsFindVersion(this_00,version);
    if (bVar1) {
      KeyFormatData::KeyFormatData(__return_storage_ptr__,this_00);
      if (bVar1) {
        ::std::vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>::~vector
                  ((vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_> *)
                   local_50);
        if (this_00 != (KeyFormatData *)local_50._8_8_) {
          return __return_storage_ptr__;
        }
        goto LAB_0047058d;
      }
    }
    this_00 = this_00 + 1;
  } while( true );
}

Assistant:

static KeyFormatData GetKeyFormatFromVersion(uint32_t version) {
  for (const auto& format_data : GetKeyFormatList()) {
    if (format_data.IsFindVersion(version)) {
      return format_data;
    }
  }
  throw CfdException(
      CfdError::kCfdIllegalArgumentError, "unsupported extkey version.");
}